

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_list.h
# Opt level: O0

range_t * __thiscall
iffl::
flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
::range_unsafe(range_t *__return_storage_ptr__,
              flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
              *this,const_iterator *it)

{
  bool bVar1;
  buffer_char_pointer pcVar2;
  buffer_type *pbVar3;
  size_t sVar4;
  pointer_type local_28;
  size_type next_offset;
  size_with_padding_t s;
  const_iterator *it_local;
  flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
  *this_local;
  
  s.size = (size_t)it;
  pcVar2 = flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
           ::get_ptr(it);
  next_offset = (size_type)
                flat_forward_list_traits_traits<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                ::get_size(pcVar2);
  (__return_storage_ptr__->super_range).buffer_begin = 0;
  (__return_storage_ptr__->super_range).data_end = 0;
  (__return_storage_ptr__->super_range).buffer_end = 0;
  pcVar2 = flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
           ::get_ptr((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                      *)s.size);
  pbVar3 = buff(this);
  (__return_storage_ptr__->super_range).buffer_begin = (long)pcVar2 - (long)pbVar3->begin;
  sVar4 = iffl::range::begin(&__return_storage_ptr__->super_range);
  (__return_storage_ptr__->super_range).data_end = sVar4 + next_offset;
  pcVar2 = flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
           ::get_ptr((flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                      *)s.size);
  local_28 = (pointer_type)
             flat_forward_list_traits_traits<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
             ::get_next_offset(pcVar2);
  if (local_28 == (pointer_type)0x0) {
    last((flat_forward_list<_FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>,_std::pmr::polymorphic_allocator<char>_>
          *)&stack0xffffffffffffffd0);
    bVar1 = flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
            ::operator!=((flat_forward_list_iterator_t<_FLAT_FORWARD_LIST_TEST_const,iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>>
                          *)&stack0xffffffffffffffd0,
                         (flat_forward_list_iterator_t<const__FLAT_FORWARD_LIST_TEST,_iffl::flat_forward_list_traits<_FLAT_FORWARD_LIST_TEST>_>
                          *)s.size);
    if (bVar1) {
      std::terminate();
    }
    sVar4 = iffl::range::begin(&__return_storage_ptr__->super_range);
    (__return_storage_ptr__->super_range).buffer_end = sVar4 + next_offset;
  }
  else {
    sVar4 = iffl::range::begin(&__return_storage_ptr__->super_range);
    (__return_storage_ptr__->super_range).buffer_end = (size_t)(local_28 + sVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

range_t range_unsafe(const_iterator const &it) const noexcept {
        size_with_padding_t const s{ traits_traits::get_size(it.get_ptr()) };
        range_t r{};
        r.buffer_begin = it.get_ptr() - buff().begin;
        r.data_end = r.begin() + s.size;
        if constexpr (traits_traits::has_next_offset_v) {
            size_type const next_offset = traits_traits::get_next_offset(it.get_ptr());
            if (0 == next_offset) {
                FFL_CODDING_ERROR_IF(last() != it);
                r.buffer_end = r.begin() + s.size;
            } else {
                r.buffer_end = r.begin() + next_offset;
            }
        } else {
            if (last() == it) {
                r.buffer_end = r.begin() + s.size;
            } else {
                r.buffer_end = r.begin() + s.size_padded();
            }
        }
        return r;
    }